

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::populate_from_list(CVmObjLookupTable *this,vm_val_t *src)

{
  int iVar1;
  vm_val_t *in_RDI;
  vm_val_t val;
  vm_val_t key;
  int i;
  int cnt;
  vm_val_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  vm_val_t *in_stack_ffffffffffffffd8;
  vm_val_t *in_stack_ffffffffffffffe0;
  undefined4 local_18;
  
  iVar1 = vm_val_t::ll_length(in_stack_ffffffffffffffc8);
  local_18 = 1;
  while (local_18 + 1 <= iVar1) {
    vm_val_t::ll_index(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4
                      );
    local_18 = local_18 + 2;
    vm_val_t::ll_index(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4
                      );
    set_or_add_entry((CVmObjLookupTable *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,in_RDI);
  }
  if (local_18 <= iVar1) {
    get_ext((CVmObjLookupTable *)in_RDI);
    vm_val_t::ll_index(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4
                      );
  }
  return;
}

Assistant:

void CVmObjLookupTable::populate_from_list(VMG_ const vm_val_t *src)
{
    /* copy elements from the source object */
    int cnt = src->ll_length(vmg0_);
    int i;
    for (i = 1 ; i + 1 <= cnt ; )
    {
        vm_val_t key, val;

        /* get the next two elements - they're always key, value pairs */
        src->ll_index(vmg_ &key, i++);
        src->ll_index(vmg_ &val, i++);

        /* set them in the table */
        set_or_add_entry(vmg_ &key, &val);
    }

    /* if there's a single remaining entry, it's the default value */
    if (i <= cnt)
        src->ll_index(vmg_ &get_ext()->default_value, i);
}